

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

void aiDecomposeMatrix(aiMatrix4x4 *mat,aiVector3D *scaling,aiQuaternion *rotation,
                      aiVector3D *position)

{
  if (rotation == (aiQuaternion *)0x0) {
    __assert_fail("__null != rotation",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x253,
                  "void aiDecomposeMatrix(const aiMatrix4x4 *, aiVector3D *, aiQuaternion *, aiVector3D *)"
                 );
  }
  if (position == (aiVector3D *)0x0) {
    __assert_fail("__null != position",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x254,
                  "void aiDecomposeMatrix(const aiMatrix4x4 *, aiVector3D *, aiQuaternion *, aiVector3D *)"
                 );
  }
  if (scaling == (aiVector3D *)0x0) {
    __assert_fail("__null != scaling",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x255,
                  "void aiDecomposeMatrix(const aiMatrix4x4 *, aiVector3D *, aiQuaternion *, aiVector3D *)"
                 );
  }
  if (mat != (aiMatrix4x4 *)0x0) {
    aiMatrix4x4t<float>::Decompose(mat,scaling,rotation,position);
    return;
  }
  __assert_fail("__null != mat",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x256,
                "void aiDecomposeMatrix(const aiMatrix4x4 *, aiVector3D *, aiQuaternion *, aiVector3D *)"
               );
}

Assistant:

ASSIMP_API void aiDecomposeMatrix(const aiMatrix4x4* mat,aiVector3D* scaling,
    aiQuaternion* rotation,
    aiVector3D* position)
{
    ai_assert( NULL != rotation );
    ai_assert( NULL != position );
    ai_assert( NULL != scaling );
    ai_assert( NULL != mat );
    mat->Decompose(*scaling,*rotation,*position);
}